

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int havingToWhereExprCb(Walker *pWalker,Expr *pExpr)

{
  Select *pSVar1;
  sqlite3 *db;
  Expr *pLeft;
  char cVar2;
  undefined2 uVar3;
  u32 uVar4;
  Expr *pEVar5;
  long lVar6;
  int iVar7;
  Expr *pEVar8;
  Walker *pWVar9;
  Expr *pEVar10;
  byte bVar11;
  Expr t;
  Walker local_70;
  
  bVar11 = 0;
  iVar7 = 0;
  if (pExpr->op != ',') {
    local_70.pParse = pWalker->pParse;
    pSVar1 = (pWalker->u).pSelect;
    local_70.u = (anon_union_8_14_c5524298_for_u)pSVar1->pGroupBy;
    local_70.eCode = '\x01';
    local_70.xExprCallback = exprNodeIsConstantOrGroupBy;
    local_70.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    walkExpr(&local_70,pExpr);
    iVar7 = 1;
    if (local_70.eCode != '\0') {
      db = pWalker->pParse->db;
      pEVar5 = sqlite3ExprAlloc(db,0x93,sqlite3IntTokens + 1,0);
      if (pEVar5 != (Expr *)0x0) {
        pLeft = pSVar1->pWhere;
        pEVar8 = pEVar5;
        pWVar9 = &local_70;
        for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
          pWVar9->pParse = *(Parse **)pEVar8;
          pEVar8 = (Expr *)((long)pEVar8 + (ulong)bVar11 * -0x10 + 8);
          pWVar9 = (Walker *)((long)pWVar9 + ((ulong)bVar11 * -2 + 1) * 8);
        }
        pEVar8 = pExpr;
        pEVar10 = pEVar5;
        for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
          cVar2 = pEVar8->affinity;
          uVar3 = *(undefined2 *)&pEVar8->field_0x2;
          uVar4 = pEVar8->flags;
          pEVar10->op = pEVar8->op;
          pEVar10->affinity = cVar2;
          *(undefined2 *)&pEVar10->field_0x2 = uVar3;
          pEVar10->flags = uVar4;
          pEVar8 = (Expr *)((long)pEVar8 + (ulong)bVar11 * -0x10 + 8);
          pEVar10 = (Expr *)((long)pEVar10 + (ulong)bVar11 * -0x10 + 8);
        }
        pWVar9 = &local_70;
        for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
          *(Parse **)pExpr = pWVar9->pParse;
          pWVar9 = (Walker *)((long)pWVar9 + ((ulong)bVar11 * -2 + 1) * 8);
          pExpr = (Expr *)((long)pExpr + (ulong)bVar11 * -0x10 + 8);
        }
        pEVar5 = sqlite3ExprAnd(db,pLeft,pEVar5);
        pSVar1->pWhere = pEVar5;
        pWalker->eCode = '\x01';
      }
    }
  }
  return iVar7;
}

Assistant:

static int havingToWhereExprCb(Walker *pWalker, Expr *pExpr){
  if( pExpr->op!=TK_AND ){
    Select *pS = pWalker->u.pSelect;
    if( sqlite3ExprIsConstantOrGroupBy(pWalker->pParse, pExpr, pS->pGroupBy) ){
      sqlite3 *db = pWalker->pParse->db;
      Expr *pNew = sqlite3ExprAlloc(db, TK_INTEGER, &sqlite3IntTokens[1], 0);
      if( pNew ){
        Expr *pWhere = pS->pWhere;
        SWAP(Expr, *pNew, *pExpr);
        pNew = sqlite3ExprAnd(db, pWhere, pNew);
        pS->pWhere = pNew;
        pWalker->eCode = 1;
      }
    }
    return WRC_Prune;
  }
  return WRC_Continue;
}